

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O3

size_t __thiscall
flatbuffers::vector_downward<unsigned_long>::ensure_space
          (vector_downward<unsigned_long> *this,size_t len)

{
  uint8_t *puVar1;
  
  puVar1 = this->scratch_;
  if ((this->cur_ < puVar1) || (puVar1 < this->buf_)) {
    __assert_fail("cur_ >= scratch_ && scratch_ >= buf_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                  ,0x8e,
                  "size_t flatbuffers::vector_downward<unsigned long>::ensure_space(size_t) [SizeT = unsigned long]"
                 );
  }
  if ((ulong)((long)this->cur_ - (long)puVar1) < len) {
    reallocate(this,len);
  }
  if (this->size_ < this->max_size_) {
    return len;
  }
  __assert_fail("size() < max_size_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                ,0x92,
                "size_t flatbuffers::vector_downward<unsigned long>::ensure_space(size_t) [SizeT = unsigned long]"
               );
}

Assistant:

size_t ensure_space(size_t len) {
    FLATBUFFERS_ASSERT(cur_ >= scratch_ && scratch_ >= buf_);
    // If the length is larger than the unused part of the buffer, we need to
    // grow.
    if (len > unused_buffer_size()) { reallocate(len); }
    FLATBUFFERS_ASSERT(size() < max_size_);
    return len;
  }